

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O0

void af_face_globals_free(AF_FaceGlobals globals)

{
  FT_Memory memory_00;
  AF_WritingSystemClass writing_system_class;
  AF_StyleClass style_class;
  FT_UInt nn;
  FT_Memory memory;
  AF_FaceGlobals globals_local;
  
  if (globals != (AF_FaceGlobals)0x0) {
    memory_00 = globals->face->memory;
    for (style_class._4_4_ = 0; style_class._4_4_ < 0x57; style_class._4_4_ = style_class._4_4_ + 1)
    {
      if (globals->metrics[style_class._4_4_] != (AF_StyleMetrics)0x0) {
        if (af_writing_system_classes[af_style_classes[style_class._4_4_]->writing_system]->
            style_metrics_done != (AF_WritingSystem_DoneMetricsFunc)0x0) {
          (*af_writing_system_classes[af_style_classes[style_class._4_4_]->writing_system]->
            style_metrics_done)(globals->metrics[style_class._4_4_]);
        }
        ft_mem_free(memory_00,globals->metrics[style_class._4_4_]);
        globals->metrics[style_class._4_4_] = (AF_StyleMetrics)0x0;
      }
    }
    ft_mem_free(memory_00,globals);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_face_globals_free( AF_FaceGlobals  globals )
  {
    if ( globals )
    {
      FT_Memory  memory = globals->face->memory;
      FT_UInt    nn;


      for ( nn = 0; nn < AF_STYLE_MAX; nn++ )
      {
        if ( globals->metrics[nn] )
        {
          AF_StyleClass          style_class =
            af_style_classes[nn];
          AF_WritingSystemClass  writing_system_class =
            af_writing_system_classes[style_class->writing_system];


          if ( writing_system_class->style_metrics_done )
            writing_system_class->style_metrics_done( globals->metrics[nn] );

          FT_FREE( globals->metrics[nn] );
        }
      }

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      hb_font_destroy( globals->hb_font );
      hb_buffer_destroy( globals->hb_buf );
#endif

      /* no need to free `globals->glyph_styles'; */
      /* it is part of the `globals' array        */
      FT_FREE( globals );
    }
  }